

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  GridNode *pGVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  Image pCVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int x;
  int iVar13;
  int y;
  ulong uVar14;
  Path path;
  Grid grid;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Setup Grid Elements");
  std::endl<char,std::char_traits<char>>(poVar5);
  grid.columns = columns;
  grid.rows = rows;
  iVar4 = columns * rows;
  uVar14 = (ulong)iVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar14;
  uVar6 = SUB168(auVar3 * ZEXT816(0x48),0);
  uVar7 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar7 = 0xffffffffffffffff;
  }
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x48),8) == 0) {
    uVar6 = uVar7;
  }
  puVar8 = (ulong *)operator_new__(uVar6);
  *puVar8 = uVar14;
  pGVar1 = (GridNode *)(puVar8 + 1);
  if (iVar4 != 0) {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)&(pGVar1->pos).x + lVar11) = 0;
      *(undefined4 *)((long)puVar8 + lVar11 + 0x10) = 0;
      *(undefined4 *)((long)puVar8 + lVar11 + 0x48) = 0;
      puVar2 = (undefined8 *)((long)puVar8 + lVar11 + 0x18);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar8 + lVar11 + 0x24);
      *puVar2 = 0;
      puVar2[1] = 0;
      lVar11 = lVar11 + 0x48;
    } while (uVar14 * 0x48 - lVar11 != 0);
  }
  for (iVar4 = 0; iVar4 < grid.rows; iVar4 = iVar4 + 1) {
    for (iVar13 = 0; iVar13 < grid.columns; iVar13 = iVar13 + 1) {
      iVar12 = grid.columns * iVar4 + iVar13;
      path.grids.list._0_4_ = gridState[iVar12];
      path.grids.count = 0;
      path.grids.capacity = 0;
      path.number = iVar13;
      path._4_4_ = iVar4;
      GridNode::operator=(pGVar1 + iVar12,(GridNode *)&path);
      std::_Vector_base<GridNode_*,_std::allocator<GridNode_*>_>::~_Vector_base
                ((_Vector_base<GridNode_*,_std::allocator<GridNode_*>_> *)&path.grids.count);
      grid.columns = columns;
    }
    grid.rows = rows;
  }
  grid.nodes = pGVar1;
  Grid::setup_neighbours(&grid);
  poVar5 = std::operator<<((ostream *)&std::cout,"Setting up Image");
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar4 = rows * size;
  iVar13 = size * columns;
  pCVar9 = get_image_from_grid(&grid);
  stbi_write_png("1.path_to_find.png",iVar13,iVar4,4,pCVar9,iVar13 * 4);
  lVar11 = std::chrono::_V2::system_clock::now();
  poVar5 = std::operator<<((ostream *)&std::cout,"Finding path....");
  std::endl<char,std::char_traits<char>>(poVar5);
  find_path(&path,&grid);
  Path::set_path(&path);
  lVar10 = std::chrono::_V2::system_clock::now();
  printf("Pathfinding time is:- %5f\n",lVar10 - lVar11);
  poVar5 = std::operator<<((ostream *)&std::cout,"Showing Result");
  std::endl<char,std::char_traits<char>>(poVar5);
  pCVar9 = get_image_from_grid(&grid);
  stbi_write_png("2.final_path.png",iVar13,iVar4,4,pCVar9,iVar13 * 4);
  if (*puVar8 != 0) {
    lVar11 = *puVar8 * 0x48;
    do {
      std::_Vector_base<GridNode_*,_std::allocator<GridNode_*>_>::~_Vector_base
                ((_Vector_base<GridNode_*,_std::allocator<GridNode_*>_> *)
                 ((long)puVar8 + lVar11 + -0x30));
      lVar11 = lVar11 + -0x48;
    } while (lVar11 != 0);
  }
  operator_delete__(puVar8);
  poVar5 = std::operator<<((ostream *)&std::cout,"Finish!!!");
  std::endl<char,std::char_traits<char>>(poVar5);
  return 0;
}

Assistant:

int main()
{
    // Setup Grid
    std::cout << "Setup Grid Elements" << std::endl;
    GridNode *nodes = new GridNode[rows * columns];
    for (int y = 0; y < rows; y++)
    {
        for (int x = 0; x < columns; x++)
        {
            nodes[y * columns + x] = GridNode(x, y, get_state_from_int(gridState[y * columns + x]));
        }
    }
    Grid grid(rows, columns, nodes);
    grid.setup_neighbours();

    // Get Image
    std::cout << "Setting up Image" << std::endl;
    int imgRows = rows * size;
    int imgColumns = columns * size;
    Image img = new Colori[imgRows * imgColumns];
    img = get_image_from_grid(&grid);
    stbi_write_png("1.path_to_find.png", imgColumns, imgRows, 4, (void *)img, imgColumns * sizeof(Colori));

    // Process Pathfinding
    auto start = std::chrono::high_resolution_clock::now();
    std::cout << "Finding path...." << std::endl;
    Path path = find_path(&grid);
    path.set_path();
    auto stop = std::chrono::high_resolution_clock::now();
    printf("Pathfinding time is:- %5f\n", std::chrono::duration_cast<std::chrono::nanoseconds>(stop - start).count());

    // Show final Result
    std::cout << "Showing Result" << std::endl;
    img = get_image_from_grid(&grid);

    stbi_write_png("2.final_path.png", imgColumns, imgRows, 4, (void *)img, imgColumns * sizeof(Colori));

    // Finish Program
    delete[] nodes;
    std::cout << "Finish!!!" << std::endl;
}